

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set_test.cc
# Opt level: O1

FileMetaData * __thiscall
leveldb::AddBoundaryInputsTest::CreateFileMetaData
          (AddBoundaryInputsTest *this,uint64_t number,InternalKey *smallest,InternalKey *largest)

{
  pointer *pppFVar1;
  iterator __position;
  FileMetaData *f;
  FileMetaData *local_28;
  
  local_28 = (FileMetaData *)operator_new(0x58);
  local_28->refs = 0;
  local_28->allowed_seeks = 0x40000000;
  local_28->file_size = 0;
  (local_28->smallest).rep_._M_dataplus._M_p = (pointer)&(local_28->smallest).rep_.field_2;
  (local_28->smallest).rep_._M_string_length = 0;
  (local_28->smallest).rep_.field_2._M_local_buf[0] = '\0';
  (local_28->largest).rep_._M_dataplus._M_p = (pointer)&(local_28->largest).rep_.field_2;
  (local_28->largest).rep_._M_string_length = 0;
  (local_28->largest).rep_.field_2._M_local_buf[0] = '\0';
  local_28->number = number;
  std::__cxx11::string::_M_assign((string *)&local_28->smallest);
  std::__cxx11::string::_M_assign((string *)&local_28->largest);
  __position._M_current =
       (this->all_files_).
       super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>._M_impl
       .super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->all_files_).
      super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<leveldb::FileMetaData*,std::allocator<leveldb::FileMetaData*>>::
    _M_realloc_insert<leveldb::FileMetaData*const&>
              ((vector<leveldb::FileMetaData*,std::allocator<leveldb::FileMetaData*>> *)
               &this->all_files_,__position,&local_28);
  }
  else {
    *__position._M_current = local_28;
    pppFVar1 = &(this->all_files_).
                super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppFVar1 = *pppFVar1 + 1;
  }
  return local_28;
}

Assistant:

FileMetaData* CreateFileMetaData(uint64_t number, InternalKey smallest,
                                   InternalKey largest) {
    FileMetaData* f = new FileMetaData();
    f->number = number;
    f->smallest = smallest;
    f->largest = largest;
    all_files_.push_back(f);
    return f;
  }